

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O3

void __thiscall flow::IRProgram::dump(IRProgram *this)

{
  pointer puVar1;
  unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *handler;
  pointer puVar2;
  
  puts("; IRProgram");
  puVar1 = (this->handlers_).
           super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->handlers_).
                super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    IRHandler::dump((puVar2->_M_t).
                    super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>
                    .super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void IRProgram::dump() {
  printf("; IRProgram\n");

  for (auto& handler : handlers_)
    handler->dump();
}